

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cc
# Opt level: O2

void RigidBodyDynamics::NonlinearEffects
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *Tau,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_ext)

{
  double *pdVar1;
  uint uVar2;
  int iVar3;
  pointer puVar4;
  pointer pSVar5;
  pointer pJVar6;
  pointer ppCVar7;
  ResScalar RVar8;
  bool bVar9;
  ulong uVar10;
  SpatialVector *mv;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  Matrix<double,_6,_1,_0,_6,_1> local_208;
  long local_1d8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
  local_1d0;
  SpatialMatrix local_1b8;
  SpatialVector local_98;
  SpatialVector local_68;
  
  local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
  local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
  local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
  local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3]._0_4_ =
       *(undefined4 *)
        (model->gravity).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
        .m_storage.m_data.array;
  local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4]._0_4_ =
       *(undefined4 *)
        ((model->gravity).super_Vector3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array + 1);
  local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3]._4_4_ =
       *(uint *)((long)(model->gravity).super_Vector3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array + 4) ^ 0x80000000;
  local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4]._4_4_ =
       *(uint *)((long)(model->gravity).super_Vector3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array + 0xc) ^ 0x80000000;
  local_98.super_Matrix<double,_6,_1,_0,_6,_1>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
       -(model->gravity).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
        .m_storage.m_data.array[2];
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
             (model->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start);
  Eigen::internal::call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Matrix<double,6,1,0,6,1>>
            (&((model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start)->super_Matrix<double,_6,_1,_0,_6,_1>,
             &local_98.super_Matrix<double,_6,_1,_0,_6,_1>);
  uVar12 = 1;
  while( true ) {
    puVar4 = (model->mJointUpdateOrder).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(model->mJointUpdateOrder).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar4 >> 2) <= uVar12) break;
    jcalc(model,puVar4[uVar12],Q,QDot);
    uVar12 = (ulong)((int)uVar12 + 1);
  }
  uVar12 = 1;
  while( true ) {
    uVar10 = ((long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(model->mBodies).
                   super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x70;
    if (uVar10 <= uVar12) break;
    uVar10 = (ulong)(model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar12];
    if (uVar10 == 0) {
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Matrix<double,6,1,0,6,1>>
                (&(model->v).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar12].
                  super_Matrix<double,_6,_1,_0,_6,_1>,
                 &(model->v_J).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar12].
                  super_Matrix<double,_6,_1,_0,_6,_1>);
      Math::SpatialTransform::apply
                ((model->X_lambda).
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar12,&local_98);
      pSVar5 = (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar1 = (double *)
               ((long)&pSVar5[uVar12].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      *pdVar1 = local_1b8.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [4];
      pdVar1[1] = local_1b8.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[5];
      pdVar1 = (double *)
               ((long)&pSVar5[uVar12].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      *pdVar1 = local_1b8.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [2];
      pdVar1[1] = local_1b8.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[3];
      *(double *)
       &pSVar5[uVar12].super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
           local_1b8.super_Matrix<double,_6,_6,_0,_6,_6>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0];
      *(double *)
       ((long)&pSVar5[uVar12].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
           local_1b8.super_Matrix<double,_6,_6,_0,_6,_6>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1];
    }
    else {
      Math::SpatialTransform::apply
                ((model->X_lambda).
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar12,
                 (model->v).
                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar10);
      local_208.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
      [1] = (double)((model->v_J).
                     super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                     super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar12);
      local_208.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
      [0] = (double)&local_1b8;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
                (&(model->v).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar12].
                  super_Matrix<double,_6,_1,_0,_6,_1>,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                  *)&local_208);
      pSVar5 = (model->c_J).
               super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      Math::crossm((model->v).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar12,
                   (model->v_J).
                   super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar12);
      local_208.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
      [0] = (double)(pSVar5 + uVar12);
      local_208.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
      [1] = (double)&local_1b8;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
                (&(model->c).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar12].
                  super_Matrix<double,_6,_1,_0,_6,_1>,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                  *)&local_208);
      Math::SpatialTransform::apply
                ((model->X_lambda).
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar12,
                 (model->a).
                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 _M_impl.super__Vector_impl_data._M_start +
                 (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar12]);
      local_208.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
      [1] = (double)((model->c).
                     super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                     super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar12);
      local_208.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
      [0] = (double)&local_1b8;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
                (&(model->a).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar12].
                  super_Matrix<double,_6,_1,_0,_6,_1>,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                  *)&local_208);
    }
    if ((model->mBodies).
        super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>.
        super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar12].mIsVirtual == false) {
      Math::SpatialRigidBodyInertia::operator*
                ((SpatialVector *)&local_1b8,
                 (model->I).
                 super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar12,
                 (model->a).
                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar12);
      mv = (model->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_start + uVar12;
      Math::SpatialRigidBodyInertia::operator*
                (&local_68,
                 (model->I).
                 super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar12,mv);
      Math::crossf(mv,&local_68);
      local_1d0.m_lhs = (LhsNested)&local_1b8;
      local_1d0.m_rhs = &local_208;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
                (&(model->f).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar12].
                  super_Matrix<double,_6,_1,_0,_6,_1>,&local_1d0);
      if (f_ext != (vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *)0x0) {
        local_1b8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = 0.0
        ;
        bVar9 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator!=
                          ((MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)
                           ((f_ext->
                            super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                            ).
                            super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar12),
                           (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                            *)&local_1b8);
        if (bVar9) {
          Math::SpatialTransform::toMatrixAdjoint
                    (&local_1b8,
                     (model->X_base).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar12);
          local_208.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
          array[1] = (double)((f_ext->
                              super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                              ).
                              super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar12);
          local_208.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
          array[0] = (double)&local_1b8;
          Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator-=
                    ((MatrixBase<Eigen::Matrix<double,6,1,0,6,1>> *)
                     ((model->f).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar12),
                     (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                      *)&local_208);
        }
      }
    }
    else {
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                 ((model->f).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar12));
    }
    uVar12 = (ulong)((int)uVar12 + 1);
  }
  uVar12 = (ulong)((int)uVar10 - 1);
  lVar11 = uVar12 * 0xc + 8;
  lVar13 = uVar12 * 0x30;
  lVar15 = uVar12 * 0x60;
  lVar14 = uVar12 * 0x90;
  for (; (int)uVar12 != 0; uVar12 = uVar12 - 1) {
    pJVar6 = (model->mJoints).
             super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             .
             super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (*(int *)((long)pJVar6 + lVar11 * 2 + -8) == 0x14) {
      uVar2 = *(uint *)((long)&pJVar6->mJointAxes + lVar11 * 2 + 4);
      ppCVar7 = (model->mCustomJoints).
                super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_208.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
      [0] = (double)(ppCVar7[uVar2] + 0x70);
      local_208.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
      [1] = (double)((long)&(((model->f).
                              super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                              .
                              super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_Matrix<double,_6,_1,_0,_6,_1>).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar13);
      local_1b8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
           (double)(ulong)*(uint *)((long)&pJVar6->mJointAxes + lVar11 * 2);
      local_1b8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
           (double)(ulong)*(uint *)(ppCVar7[uVar2] + 8);
      local_1b8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
           (double)((Tau->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data + (long)local_1b8.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[4]);
      local_1b8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
           (double)(Tau->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_rows;
      local_1b8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
           4.94065645841247e-324;
      local_1b8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
      local_1b8.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
           (double)Tau;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,_1,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,6,1,0,6,1>,0>>
                ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false> *)&local_1b8,
                 (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                  *)&local_208);
    }
    else {
      iVar3 = *(int *)((long)pJVar6 + lVar11 * 2 + -4);
      if (iVar3 == 3) {
        local_208.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
        array[0] = (double)((long)&(((model->multdof3_S).
                                     super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                     .
                                     super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                                   m_storage + lVar14);
        local_208.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
        array[1] = (double)((long)&(((model->f).
                                     super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                                     .
                                     super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_Matrix<double,_6,_1,_0,_6,_1>).
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                           lVar13);
        local_1b8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
             (double)(ulong)*(uint *)((long)&pJVar6->mJointAxes + lVar11 * 2);
        local_1b8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
             (double)((Tau->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data +
                     (long)local_1b8.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[3]);
        local_1b8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] =
             (double)(Tau->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                     .m_rows;
        local_1b8.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
             (double)Tau;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,1,0,6,1>,0>>
                  ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)&local_1b8,
                   (Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                    *)&local_208);
      }
      else if (iVar3 == 1) {
        RVar8 = Eigen::internal::
                dot_nocheck<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_false>
                ::run((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                      ((long)&(((model->S).
                                super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                                .
                                super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_Matrix<double,_6,_1,_0,_6,_1>).
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar13)
                      ,(MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                       ((long)&(((model->f).
                                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                                 .
                                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_Matrix<double,_6,_1,_0,_6,_1>).
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar13
                       ));
        (Tau->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
        [*(uint *)((long)&((model->mJoints).
                           super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                           ._M_impl.super__Vector_impl_data._M_start)->mJointAxes + lVar11 * 2)] =
             RVar8;
      }
    }
    uVar10 = (ulong)(model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar12];
    if (uVar10 != 0) {
      pSVar5 = (model->f).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_1d8 = lVar14;
      Math::SpatialTransform::applyTranspose
                ((SpatialTransform *)
                 ((long)&(((model->X_lambda).
                           super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d + lVar15),
                 (SpatialVector *)
                 ((long)&(pSVar5->super_Matrix<double,_6,_1,_0,_6,_1>).
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar13));
      lVar14 = local_1d8;
      local_208.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
      [0] = (double)(pSVar5 + uVar10);
      local_208.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
      [1] = (double)&local_1b8;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
                (&(model->f).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start
                  [(model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar12]].
                  super_Matrix<double,_6,_1,_0,_6,_1>,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                  *)&local_208);
    }
    lVar11 = lVar11 + -0xc;
    lVar13 = lVar13 + -0x30;
    lVar15 = lVar15 + -0x60;
    lVar14 = lVar14 + -0x90;
  }
  return;
}

Assistant:

RBDL_DLLAPI void NonlinearEffects ( 
    Model &model,
    const VectorNd &Q,
    const VectorNd &QDot,
    VectorNd &Tau,
    std::vector<Math::SpatialVector> *f_ext) {
  LOG << "-------- " << __func__ << " --------" << std::endl;

  SpatialVector spatial_gravity (0., 0., 0., -model.gravity[0], -model.gravity[1], -model.gravity[2]);

  // Reset the velocity of the root body
  model.v[0].setZero();
  model.a[0] = spatial_gravity;

  for (unsigned int i = 1; i < model.mJointUpdateOrder.size(); i++) {
    jcalc (model, model.mJointUpdateOrder[i], Q, QDot);
  }

  for (unsigned int i = 1; i < model.mBodies.size(); i++) {
    if (model.lambda[i] == 0) {
      model.v[i] = model.v_J[i];
      model.a[i] = model.X_lambda[i].apply(spatial_gravity);
    }	else {
      model.v[i] = model.X_lambda[i].apply(model.v[model.lambda[i]]) + model.v_J[i];
      model.c[i] = model.c_J[i] + crossm(model.v[i],model.v_J[i]);
      model.a[i] = model.X_lambda[i].apply(model.a[model.lambda[i]]) + model.c[i];
    }

    if (!model.mBodies[i].mIsVirtual) {
      model.f[i] = model.I[i] * model.a[i] + crossf(model.v[i],model.I[i] * model.v[i]);
#ifdef RBDL_USE_CASADI_MATH
      if (f_ext != NULL)
#else
      if (f_ext != NULL && (*f_ext)[i] != SpatialVector::Zero())
#endif
      {
        model.f[i] -= model.X_base[i].toMatrixAdjoint() * (*f_ext)[i];
      }            
    } else {
      model.f[i].setZero();
    }
  }

  for (unsigned int i = model.mBodies.size() - 1; i > 0; i--) {
    if(model.mJoints[i].mJointType != JointTypeCustom){
      if (model.mJoints[i].mDoFCount == 1) {
        Tau[model.mJoints[i].q_index]
          = model.S[i].dot(model.f[i]);
      } else if (model.mJoints[i].mDoFCount == 3) {
        Tau.block<3,1>(model.mJoints[i].q_index, 0)
          = model.multdof3_S[i].transpose() * model.f[i];
      }
    } else if(model.mJoints[i].mJointType == JointTypeCustom) {
      unsigned int k = model.mJoints[i].custom_joint_index;
      Tau.block(model.mJoints[i].q_index,0,
          model.mCustomJoints[k]->mDoFCount, 1)
        = model.mCustomJoints[k]->S.transpose() * model.f[i];
    }

    if (model.lambda[i] != 0) {
      model.f[model.lambda[i]] = model.f[model.lambda[i]] + model.X_lambda[i].applyTranspose(model.f[i]);
    }
  }
}